

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GrowableArray.h
# Opt level: O2

Array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_unsigned_long)>
* Corrade::Containers::
  arrayAppend<Corrade::Containers::Array<std::__cxx11::string,void(*)(std::__cxx11::string*,unsigned_long)>,Corrade::Containers::ArrayNewAllocator<Corrade::Containers::Array<std::__cxx11::string,void(*)(std::__cxx11::string*,unsigned_long)>>>
            (Array<Corrade::Containers::Array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_unsigned_long)>,_void_(*)(Corrade::Containers::Array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_unsigned_long)>_*,_unsigned_long)>
             *array)

{
  Array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_unsigned_long)>
  *pAVar1;
  
  pAVar1 = Implementation::
           arrayGrowBy<Corrade::Containers::Array<std::__cxx11::string,void(*)(std::__cxx11::string*,unsigned_long)>,Corrade::Containers::ArrayNewAllocator<Corrade::Containers::Array<std::__cxx11::string,void(*)(std::__cxx11::string*,unsigned_long)>>>
                     (array,1);
  pAVar1->_data = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  pAVar1->_size = 0;
  pAVar1->_deleter =
       (_func_void_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_ptr_unsigned_long
        *)0x0;
  return pAVar1;
}

Assistant:

T& arrayAppend(Array<T>& array, Corrade::InPlaceInitT, Args&&... args) {
    T* const it = Implementation::arrayGrowBy<T, Allocator>(array, 1);
    /* No helper function as there's no way we could memcpy such a thing. */
    /* On GCC 4.8 this includes another workaround, see the 4.8-specific
       overload docs for details */
    Implementation::construct(*it, Utility::forward<Args>(args)...);
    return *it;
}